

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_symlink(uv_loop_t *loop,uv_fs_t *req,char *path,char *new_path,int flags,uv_fs_cb cb)

{
  size_t sVar1;
  uv__work *w;
  _func_void_uv__work_ptr_int *done;
  void *pvVar2;
  char *in_RCX;
  uv__work *in_RDX;
  uv_req_t *in_RSI;
  uv_loop_t *in_RDI;
  undefined4 in_R8D;
  uv__work *in_R9;
  size_t new_path_len;
  size_t path_len;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  uv__req_init(in_RDI,in_RSI,UV_FS);
  *(undefined4 *)&in_RSI[1].data = 0x16;
  in_RSI[1].active_queue[1] = (void *)0x0;
  in_RSI[2].data = (void *)0x0;
  *(uv_loop_t **)&in_RSI[1].type = in_RDI;
  *(undefined8 *)&in_RSI[2].type = 0;
  in_RSI[7].active_queue[0] = (void *)0x0;
  in_RSI[1].active_queue[0] = in_R9;
  sVar1 = strlen((char *)in_RDX);
  w = (uv__work *)(sVar1 + 1);
  sVar1 = strlen(in_RCX);
  done = (_func_void_uv__work_ptr_int *)(sVar1 + 1);
  pvVar2 = malloc((size_t)(done + (long)(w->wq + -3)));
  *(void **)&in_RSI[2].type = pvVar2;
  if (*(long *)&in_RSI[2].type == 0) {
    local_4 = -0xc;
  }
  else {
    in_RSI[7].active_queue[0] = (code *)((long)w->wq + *(long *)&in_RSI[2].type + -0x18);
    memcpy(*(void **)&in_RSI[2].type,in_RDX,(size_t)w);
    memcpy(in_RSI[7].active_queue[0],in_RCX,(size_t)done);
    *(undefined4 *)((long)in_RSI[7].active_queue + 0xc) = in_R8D;
    if (in_R9 == (uv__work *)0x0) {
      uv__fs_work(in_RDX);
      uv__fs_done(w,(int)((ulong)done >> 0x20));
      local_4 = (int)in_RSI[1].active_queue[1];
    }
    else {
      uv__work_submit((uv_loop_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_R9,
                      (_func_void_uv__work_ptr *)w,done);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int uv_fs_symlink(uv_loop_t* loop,
                  uv_fs_t* req,
                  const char* path,
                  const char* new_path,
                  int flags,
                  uv_fs_cb cb) {
  INIT(SYMLINK);
  PATH2;
  req->flags = flags;
  POST;
}